

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int setChildPtrmaps(MemPage *pPage)

{
  u8 uVar1;
  u8 uVar2;
  ushort uVar3;
  ushort uVar4;
  Pgno parent;
  BtShared *pBt;
  u8 *puVar5;
  u32 uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pBt = pPage->pBt;
  parent = pPage->pgno;
  if (pPage->isInit == '\0') {
    local_3c = btreeInitPage(pPage);
    if (local_3c != 0) goto LAB_0013c5f9;
  }
  else {
    local_3c = 0;
  }
  uVar3 = pPage->nCell;
  for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
    uVar4 = pPage->maskPage;
    uVar1 = pPage->aCellIdx[uVar7 * 2];
    uVar2 = pPage->aCellIdx[uVar7 * 2 + 1];
    puVar5 = pPage->aData;
    ptrmapPutOvflPtr(pPage,pPage,puVar5 + (CONCAT11(uVar1,uVar2) & uVar4),&local_3c);
    if (pPage->leaf == '\0') {
      uVar6 = sqlite3Get4byte(puVar5 + (CONCAT11(uVar1,uVar2) & uVar4));
      ptrmapPut(pBt,uVar6,'\x05',parent,&local_3c);
    }
  }
  if (pPage->leaf == '\0') {
    uVar6 = sqlite3Get4byte(pPage->aData + (ulong)pPage->hdrOffset + 8);
    ptrmapPut(pBt,uVar6,'\x05',parent,&local_3c);
  }
LAB_0013c5f9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_3c;
}

Assistant:

static int setChildPtrmaps(MemPage *pPage){
  int i;                             /* Counter variable */
  int nCell;                         /* Number of cells in page pPage */
  int rc;                            /* Return code */
  BtShared *pBt = pPage->pBt;
  Pgno pgno = pPage->pgno;

  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  rc = pPage->isInit ? SQLITE_OK : btreeInitPage(pPage);
  if( rc!=SQLITE_OK ) return rc;
  nCell = pPage->nCell;

  for(i=0; i<nCell; i++){
    u8 *pCell = findCell(pPage, i);

    ptrmapPutOvflPtr(pPage, pPage, pCell, &rc);

    if( !pPage->leaf ){
      Pgno childPgno = get4byte(pCell);
      ptrmapPut(pBt, childPgno, PTRMAP_BTREE, pgno, &rc);
    }
  }

  if( !pPage->leaf ){
    Pgno childPgno = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    ptrmapPut(pBt, childPgno, PTRMAP_BTREE, pgno, &rc);
  }

  return rc;
}